

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

int icu_63::number::impl::PatternStringUtils::escapePaddingString
              (UnicodeString *input,UnicodeString *output,int startIndex,UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  uint uVar3;
  int iVar4;
  char16_t cVar5;
  uint uVar6;
  char16_t *pcVar7;
  int32_t iVar8;
  int iVar9;
  ulong uVar10;
  UChar local_70;
  int16_t local_6e;
  int local_6c;
  char16_t *local_68;
  char16_t *local_50;
  char16_t *local_40;
  
  sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (input->fUnion).fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  if (iVar9 == 0) {
    UnicodeString::unBogus(input);
    sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (input->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(input,0,iVar8,L" ",0,-1);
  }
  sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (input->fUnion).fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  local_6e = (output->fUnion).fStackFields.fLengthAndFlags;
  local_6c = (output->fUnion).fFields.fLength;
  if (iVar9 == 1) {
    iVar2 = UnicodeString::doCompare(input,0,1,L"\'",0,-1);
    local_50 = L"\'";
    if (iVar2 == '\0') {
      UnicodeString::doReplace(output,startIndex,0,L"\'\'",0,-1);
    }
    else {
      sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace(output,startIndex,0,input,0,iVar8);
    }
  }
  else {
    local_70 = L'\'';
    iVar9 = 1;
    UnicodeString::doReplace(output,startIndex,0,&local_70,0,1);
    sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
    uVar3 = (uint)sVar1;
    if (sVar1 < 0) {
      uVar6 = (input->fUnion).fFields.fLength;
    }
    else {
      uVar6 = (int)uVar3 >> 5;
    }
    if (0 < (int)uVar6) {
      local_68 = (char16_t *)((long)&input->fUnion + 2);
      iVar9 = 1;
      uVar10 = 0;
      do {
        cVar5 = L'\xffff';
        if (uVar10 < uVar6) {
          pcVar7 = local_68;
          if ((uVar3 & 2) == 0) {
            pcVar7 = (input->fUnion).fFields.fArray;
          }
          cVar5 = pcVar7[uVar10];
        }
        if (cVar5 == L'\'') {
          UnicodeString::doReplace(output,iVar9 + startIndex,0,L"\'\'",0,-1);
          local_40 = L"\'\'";
          iVar4 = 2;
        }
        else {
          iVar4 = 1;
          local_70 = cVar5;
          UnicodeString::doReplace(output,iVar9 + startIndex,0,&local_70,0,1);
        }
        sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
        uVar3 = (uint)sVar1;
        if (sVar1 < 0) {
          uVar6 = (input->fUnion).fFields.fLength;
        }
        else {
          uVar6 = (int)uVar3 >> 5;
        }
        iVar9 = iVar9 + iVar4;
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)(int)uVar6);
    }
    local_70 = L'\'';
    UnicodeString::doReplace(output,iVar9 + startIndex,0,&local_70,0,1);
  }
  iVar9 = (int)local_6e >> 5;
  if (local_6e < 0) {
    iVar9 = local_6c;
  }
  sVar1 = (output->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (output->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  return iVar4 - iVar9;
}

Assistant:

int PatternStringUtils::escapePaddingString(UnicodeString input, UnicodeString& output, int startIndex,
                                            UErrorCode& status) {
    (void) status;
    if (input.length() == 0) {
        input.setTo(kFallbackPaddingString, -1);
    }
    int startLength = output.length();
    if (input.length() == 1) {
        if (input.compare(u"'", -1) == 0) {
            output.insert(startIndex, u"''", -1);
        } else {
            output.insert(startIndex, input);
        }
    } else {
        output.insert(startIndex, u'\'');
        int offset = 1;
        for (int i = 0; i < input.length(); i++) {
            // it's okay to deal in chars here because the quote mark is the only interesting thing.
            char16_t ch = input.charAt(i);
            if (ch == u'\'') {
                output.insert(startIndex + offset, u"''", -1);
                offset += 2;
            } else {
                output.insert(startIndex + offset, ch);
                offset += 1;
            }
        }
        output.insert(startIndex + offset, u'\'');
    }
    return output.length() - startLength;
}